

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [29])

{
  AssertionResult *in_RSI;
  AssertionResult *in_RDI;
  char (*in_stack_ffffffffffffffb8) [29];
  Message *in_stack_ffffffffffffffe8;
  
  Message::Message((Message *)in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  AppendMessage(in_RSI,in_stack_ffffffffffffffe8);
  Message::~Message((Message *)0x143098);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }